

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_aspect.c
# Opt level: O0

log_aspect log_aspect_create(log_impl impl,log_aspect_interface iface,log_aspect_ctor ctor)

{
  int iVar1;
  log_aspect_data pvVar2;
  log_aspect_ctor in_RDX;
  log_aspect_interface in_RSI;
  log_impl in_RDI;
  log_aspect aspect;
  log_aspect local_8;
  
  if (in_RSI == (log_aspect_interface)0x0) {
    local_8 = (log_aspect)0x0;
  }
  else {
    local_8 = (log_aspect)malloc(0x38);
    if (local_8 == (log_aspect)0x0) {
      local_8 = (log_aspect)0x0;
    }
    else {
      local_8->impl = in_RDI;
      local_8->restrict_cb = (log_aspect_restrict_cb)0x0;
      local_8->policies = (log_policy *)0x0;
      local_8->count = 0;
      local_8->size = 0;
      local_8->data = (log_aspect_data)0x0;
      local_8->iface = in_RSI;
      pvVar2 = (*local_8->iface->create)(local_8,in_RDX);
      if (pvVar2 == (log_aspect_data)0x0) {
        if (((local_8->policies == (log_policy *)0x0) && (local_8->size == 0)) &&
           (iVar1 = log_aspect_reserve(local_8,0x1061cb), iVar1 != 0)) {
          free(local_8);
          local_8 = (log_aspect)0x0;
        }
      }
      else {
        free(local_8);
        local_8 = (log_aspect)0x0;
      }
    }
  }
  return local_8;
}

Assistant:

log_aspect log_aspect_create(log_impl impl, const log_aspect_interface iface, const log_aspect_ctor ctor)
{
	if (iface != NULL)
	{
		log_aspect aspect = malloc(sizeof(struct log_aspect_type));

		if (aspect == NULL)
		{
			return NULL;
		}

		aspect->impl = impl;
		aspect->restrict_cb = NULL;
		aspect->policies = NULL;
		aspect->count = 0;
		aspect->size = 0;
		aspect->data = NULL;
		aspect->iface = iface;

		if (aspect->iface->create(aspect, ctor) != 0)
		{
			free(aspect);

			return NULL;
		}

		if (aspect->policies == NULL && aspect->size == 0)
		{
			if (log_aspect_reserve(aspect, LOG_ASPECT_POLICIES_DEFAULT_SIZE) != 0)
			{
				free(aspect);

				return NULL;
			}
		}

		return aspect;
	}

	return NULL;
}